

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMulsMusashi<(moira::Core)0,(moira::Instr)81,(moira::Mode)8,2>
          (Moira *this,u16 opcode)

{
  u32 uVar1;
  ulong uVar2;
  u32 data;
  u32 ea;
  u32 local_20;
  u32 local_1c;
  
  uVar2 = (ulong)(opcode >> 9 & 7);
  readOp<(moira::Core)0,(moira::Mode)8,2,0ull>(this,opcode & 7,&local_1c,&local_20);
  prefetch<(moira::Core)0,4ull>(this);
  uVar1 = muls<(moira::Core)0>
                    (this,local_20,(uint)*(ushort *)((long)&(this->reg).field_3 + uVar2 * 4));
  *(u32 *)((long)&(this->reg).field_3 + uVar2 * 4) = uVar1;
  return;
}

Assistant:

void
Moira::execMulsMusashi(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    readOp<C, M, Word>(src, &ea, &data);

    prefetch<C, POLL>();
    result = muls<C>(data, readD<Word>(dst));

    if constexpr (I == Instr::MULU) { SYNC_68000(50); SYNC_68010(26); }
    if constexpr (I == Instr::MULS) { SYNC_68000(50); SYNC_68010(28); }

    writeD(dst, result);
}